

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitutils.h
# Opt level: O0

uint spvtools::utils::SignExtendValue<unsigned_int>(uint value,uint32_t number_of_bits)

{
  bool bVar1;
  bool is_negative;
  uint32_t bit_width;
  uint32_t number_of_bits_local;
  uint value_local;
  
  number_of_bits_local = value;
  if (number_of_bits != 0x20) {
    bVar1 = IsBitAtPositionSet<unsigned_int>(value,(ulong)(number_of_bits - 1));
    if (bVar1) {
      bit_width = SetHighBits<unsigned_int>(value,(ulong)(0x20 - number_of_bits));
    }
    else {
      bit_width = ClearHighBits<unsigned_int>(value,(ulong)(0x20 - number_of_bits));
    }
    number_of_bits_local = bit_width;
  }
  return number_of_bits_local;
}

Assistant:

T SignExtendValue(T value, uint32_t number_of_bits) {
  const uint32_t bit_width = sizeof(value) * 8;
  if (number_of_bits == bit_width) return value;

  bool is_negative = utils::IsBitAtPositionSet(value, number_of_bits - 1);
  if (is_negative) {
    value = utils::SetHighBits(value, bit_width - number_of_bits);
  } else {
    value = utils::ClearHighBits(value, bit_width - number_of_bits);
  }
  return value;
}